

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::CompilerGLSL::type_can_zero_initialize(CompilerGLSL *this,SPIRType *type)

{
  bool *pbVar1;
  size_t sVar2;
  bool *pbVar3;
  TypedID<(diligent_spirv_cross::Types)1> *pTVar4;
  bool bVar5;
  SPIRType *pSVar6;
  size_t sVar7;
  long lVar8;
  bool bVar9;
  
  if ((type->pointer == false) &&
     (((type->array).super_VectorView<unsigned_int>.buffer_size == 0 ||
      ((this->options).flatten_multidimensional_arrays == false)))) {
    sVar2 = (type->array_size_literal).super_VectorView<bool>.buffer_size;
    bVar9 = sVar2 == 0;
    if (!bVar9) {
      pbVar3 = (type->array_size_literal).super_VectorView<bool>.ptr;
      if (*pbVar3 == true) {
        sVar7 = 1;
        do {
          bVar9 = sVar2 == sVar7;
          if (bVar9) goto LAB_0074b0df;
          pbVar1 = pbVar3 + sVar7;
          sVar7 = sVar7 + 1;
        } while (*pbVar1 != false);
      }
      if (!bVar9) goto LAB_0074b156;
    }
LAB_0074b0df:
    sVar2 = (type->member_types).
            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
            buffer_size;
    bVar9 = sVar2 == 0;
    if (!bVar9) {
      pTVar4 = (type->member_types).
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.ptr;
      pSVar6 = Variant::get<diligent_spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.
                          super_VectorView<diligent_spirv_cross::Variant>.ptr + pTVar4->id);
      bVar5 = type_can_zero_initialize(this,pSVar6);
      if (bVar5) {
        lVar8 = 4;
        do {
          bVar9 = sVar2 << 2 == lVar8;
          if (bVar9) {
            return bVar9;
          }
          pSVar6 = Variant::get<diligent_spirv_cross::SPIRType>
                             ((this->super_Compiler).ir.ids.
                              super_VectorView<diligent_spirv_cross::Variant>.ptr +
                              *(uint *)((long)&pTVar4->id + lVar8));
          bVar5 = type_can_zero_initialize(this,pSVar6);
          lVar8 = lVar8 + 4;
        } while (bVar5);
      }
    }
  }
  else {
LAB_0074b156:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool CompilerGLSL::type_can_zero_initialize(const SPIRType &type) const
{
	if (type.pointer)
		return false;

	if (!type.array.empty() && options.flatten_multidimensional_arrays)
		return false;

	for (auto &literal : type.array_size_literal)
		if (!literal)
			return false;

	for (auto &memb : type.member_types)
		if (!type_can_zero_initialize(get<SPIRType>(memb)))
			return false;

	return true;
}